

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void __thiscall
features::Sift::orientation_assignment
          (Sift *this,Keypoint *kp,Octave *octave,
          vector<float,_std::allocator<float>_> *orientations)

{
  int iVar1;
  int i;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  float *pfVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int dx;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_128 [2];
  float hist [36];
  ConstPtr ori;
  long local_70;
  ConstPtr grad;
  float local_44;
  float local_40;
  float dist;
  float local_38;
  float local_34;
  
  for (lVar4 = 0; lVar4 != 0x90; lVar4 = lVar4 + 4) {
    *(undefined4 *)((long)local_128 + lVar4) = 0;
  }
  iVar11 = (int)(kp->x + 0.5);
  dist = kp->y + 0.5;
  local_34 = kp->sample;
  if (local_34 <= 0.0) {
    fVar13 = ceilf(local_34 + -0.5);
  }
  else {
    fVar13 = floorf(local_34 + 0.5);
  }
  local_40 = (this->options).base_blur_sigma;
  local_38 = exp2f((local_34 + 1.0) / (float)(this->options).num_samples_per_octave);
  local_38 = local_38 * local_40;
  std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<float>,void>
            ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             &(octave->grad).
              super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)(int)fVar13 + 1].
              super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<float>,void>
            ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)(hist + 0x22),
             &(octave->ori).
              super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)(int)fVar13 + 1].
              super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
  local_38 = local_38 * 1.5;
  uVar10 = (uint)(local_38 * 3.0);
  if (((int)uVar10 <= iVar11) && (iVar1 = *(int *)(local_70 + 8), (int)(uVar10 + iVar11) < iVar1)) {
    iVar7 = (int)dist;
    if (((int)uVar10 <= iVar7) && ((int)(uVar10 + iVar7) < *(int *)(local_70 + 0xc))) {
      iVar2 = -uVar10;
      fVar13 = kp->x;
      fVar15 = kp->y;
      lVar4 = (long)iVar2;
      ori.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar10;
      iVar9 = (iVar7 - uVar10) * iVar1 + iVar11;
      for (; iVar2 <= (int)ori.
                           super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi; iVar2 = iVar2 + 1) {
        fVar16 = (float)iVar2 + ((float)iVar7 - fVar15);
        fVar16 = fVar16 * fVar16;
        dist = fVar16;
        for (lVar12 = lVar4; lVar12 <= (int)uVar10; lVar12 = lVar12 + 1) {
          fVar14 = (float)(int)lVar12 + ((float)iVar11 - fVar13);
          local_44 = fVar14 * fVar14 + fVar16;
          if (local_44 <= (float)(int)(uVar10 * uVar10) + 0.5) {
            lVar8 = (long)(iVar9 + (int)lVar12);
            local_34 = *(float *)(*(long *)(local_70 + 0x18) + lVar8 * 4);
            local_40 = *(float *)(*(long *)(hist._136_8_ + 0x18) + lVar8 * 4);
            grad.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = local_38;
            fVar16 = math::gaussian_xx<float>
                               (&local_44,
                                (float *)((long)&grad.
                                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi + 4));
            uVar3 = (uint)((local_40 * 36.0) / 6.2831855);
            if (0x22 < (int)uVar3) {
              uVar3 = 0x23;
            }
            uVar5 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar5 = 0;
            }
            local_128[uVar5] = local_34 * fVar16 + local_128[uVar5];
            fVar16 = dist;
          }
        }
        iVar9 = iVar9 + iVar1;
      }
      for (iVar11 = 0; fVar13 = local_128[0], lVar4 = 1, fVar15 = hist[0x21], fVar16 = local_128[0],
          iVar11 != 6; iVar11 = iVar11 + 1) {
        for (; lVar4 != 0x24; lVar4 = lVar4 + 1) {
          pfVar6 = local_128 + lVar4;
          local_128[lVar4 + -1] = (fVar15 + fVar16 + *pfVar6) / 3.0;
          fVar15 = fVar16;
          fVar16 = *pfVar6;
        }
        hist[0x21] = (fVar13 + fVar15 + hist[0x21]) / 3.0;
      }
      pfVar6 = std::__max_element<float*,__gnu_cxx::__ops::_Iter_less_iter>(local_128,hist + 0x22);
      local_34 = *pfVar6 * 0.8;
      lVar4 = 0;
      fVar13 = *pfVar6 * 0.8;
      while (lVar4 != 0x24) {
        iVar11 = (int)lVar4;
        uVar5 = (ulong)(iVar11 - 1);
        if (lVar4 == 0) {
          uVar5 = 0x23;
        }
        fVar15 = local_128[lVar4];
        lVar8 = lVar4 + 1;
        lVar12 = 0;
        if (lVar4 != 0x23) {
          lVar12 = lVar8;
        }
        lVar4 = lVar8;
        if (((fVar13 < fVar15) && (fVar16 = local_128[uVar5], fVar16 < fVar15)) &&
           (fVar14 = local_128[lVar12], fVar14 < fVar15)) {
          local_44 = ((((float)iVar11 -
                       ((fVar14 - fVar16) * 0.5) / ((fVar16 - (fVar15 + fVar15)) + fVar14)) + 0.5) *
                     6.2831855) / 36.0;
          std::vector<float,_std::allocator<float>_>::push_back(orientations,&local_44);
          fVar13 = local_34;
        }
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ori);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&grad);
  return;
}

Assistant:

void
Sift::orientation_assignment (Keypoint const& kp,
    Octave const* octave, std::vector<float>& orientations)
{
    int const nbins = 36;
    float const nbinsf = static_cast<float>(nbins);

    /* Prepare 36-bin histogram. */
    float hist[nbins];
    std::fill(hist, hist + nbins, 0.0f);

    /* Integral x and y coordinates and closest scale sample. */
    int const ix = static_cast<int>(kp.x + 0.5f);
    int const iy = static_cast<int>(kp.y + 0.5f);
    int const is = static_cast<int>(math::round(kp.sample));
    float const sigma = this->keypoint_relative_scale(kp);

    /* Images with its dimension for the keypoint. */
    core::FloatImage::ConstPtr grad(octave->grad[is + 1]);
    core::FloatImage::ConstPtr ori(octave->ori[is + 1]);
    int const width = grad->width();
    int const height = grad->height();

    /*
     * Compute window size 'win', the full window has  2 * win + 1  pixel.
     * The factor 3 makes the window large enough such that the gaussian
     * has very little weight beyond the window. The value 1.5 is from
     * the SIFT paper. If the window goes beyond the image boundaries,
     * the keypoint is discarded.
     */
    float const sigma_factor = 1.5f;
    int win = static_cast<int>(sigma * sigma_factor * 3.0f);
    if (ix < win || ix + win >= width || iy < win || iy + win >= height)
        return;

    /* Center of keypoint index. */
    int center = iy * width + ix;
    float const dxf = kp.x - static_cast<float>(ix);
    float const dyf = kp.y - static_cast<float>(iy);
    float const maxdist = static_cast<float>(win*win) + 0.5f;

    /* Populate histogram over window, intersected with (1,1), (w-2,h-2). */
    for (int dy = -win; dy <= win; ++dy)
    {
        int const yoff = dy * width;
        for (int dx = -win; dx <= win; ++dx)
        {
            /* Limit to circular window (centered at accurate keypoint). */
            float const dist = MATH_POW2(dx-dxf) + MATH_POW2(dy-dyf);
            if (dist > maxdist)
                continue;

            float gm = grad->at(center + yoff + dx); // gradient magnitude
            float go = ori->at(center + yoff + dx); // gradient orientation
            float weight = math::gaussian_xx(dist, sigma * sigma_factor);
            int bin = static_cast<int>(nbinsf * go / (2.0f * MATH_PI));
            bin = math::clamp(bin, 0, nbins - 1);
            hist[bin] += gm * weight;
        }
    }

    /* Smooth histogram. */
    for (int i = 0; i < 6; ++i)
    {
        float first = hist[0];
        float prev = hist[nbins - 1];
        for (int j = 0; j < nbins - 1; ++j)
        {
            float current = hist[j];
            hist[j] = (prev + current + hist[j + 1]) / 3.0f;
            prev = current;
        }
        hist[nbins - 1] = (prev + hist[nbins - 1] + first) / 3.0f;
    }

    /* Find maximum element. */
    float maxh = *std::max_element(hist, hist + nbins);

    /* Find peaks within 80% of max element. */
    for (int i = 0; i < nbins; ++i)
    {
        float h0 = hist[(i + nbins - 1) % nbins];
        float h1 = hist[i];
        float h2 = hist[(i + 1) % nbins];

        /* These peaks must be a local maximum! */
        if (h1 <= 0.8f * maxh || h1 <= h0 || h1 <= h2)
            continue;

        /*
         * Quadratic interpolation to find accurate maximum.
         * f(x) = ax^2 + bx + c, f(-1) = h0, f(0) = h1, f(1) = h2
         * --> a = 1/2 (h0 - 2h1 + h2), b = 1/2 (h2 - h0), c = h1.
         * x = f'(x) = 2ax + b = 0 --> x = -1/2 * (h2 - h0) / (h0 - 2h1 + h2)
         */
        float x = -0.5f * (h2 - h0) / (h0 - 2.0f * h1 + h2);
        float o =  2.0f * MATH_PI * (x + (float)i + 0.5f) / nbinsf;
        orientations.push_back(o);
    }
}